

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockSupport_c_hasReturnValue_TestShell::createTest
          (TEST_MockSupport_c_hasReturnValue_TestShell *this)

{
  Utest *this_00;
  TEST_MockSupport_c_hasReturnValue_TestShell *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupport_cTest.cpp"
                                  ,0x40);
  TEST_MockSupport_c_hasReturnValue_Test::TEST_MockSupport_c_hasReturnValue_Test
            ((TEST_MockSupport_c_hasReturnValue_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockSupport_c, hasReturnValue)
{
    mock_c()->expectOneCall("foo");
    CHECK(mock_c()->actualCall("foo")->hasReturnValue() == 0);
    CHECK(mock_c()->hasReturnValue() == 0);

    mock_c()->expectOneCall("foo2")->andReturnIntValue(1);
    CHECK(mock_c()->actualCall("foo2")->hasReturnValue() != 0);
    CHECK(mock_c()->hasReturnValue() != 0);
}